

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbsdf.c
# Opt level: O1

FT_Error bsdf_approximate_edge(BSDF_Worker *worker)

{
  ulong uVar1;
  ED *pEVar2;
  bool bVar3;
  uint uVar4;
  FT_Error FVar5;
  FT_Long FVar6;
  long lVar7;
  long lVar8;
  FT_Fixed FVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  ED *pEVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  bool bVar24;
  FT_Vector local_68;
  ED *local_58;
  BSDF_Worker *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  FVar5 = 6;
  if ((worker != (BSDF_Worker *)0x0) && (pEVar20 = worker->distance_map, pEVar20 != (ED *)0x0)) {
    if (0 < worker->rows) {
      uVar23 = 0;
      local_58 = pEVar20;
      local_50 = worker;
      do {
        uVar16 = worker->width;
        if (0 < (int)uVar16) {
          iVar14 = (int)uVar23;
          iVar10 = iVar14 + 1;
          iVar22 = 0;
          local_40 = uVar23;
          do {
            iVar15 = (int)uVar23;
            pEVar2 = worker->distance_map;
            lVar21 = (long)(int)(uVar16 * iVar15 + iVar22);
            if (pEVar2[lVar21].alpha == '\0') {
LAB_00241f1b:
              pEVar20[lVar21].dist = 0x1900000;
              pEVar20[lVar21].prox.x = 0xc80000;
              pEVar20[lVar21].prox.y = 0xc80000;
            }
            else {
              iVar12 = worker->rows;
              if (pEVar2[lVar21].alpha == 0xff) {
                iVar17 = 0;
                if ((iVar12 < iVar15 || iVar14 == 0) ||
                   (iVar17 = 1, pEVar2[lVar21 + (int)-uVar16].alpha != '\0')) {
                  if (iVar10 < iVar12) {
                    if (pEVar2[lVar21 + (ulong)uVar16].alpha == '\0') goto LAB_00241f37;
                    iVar17 = iVar17 + 1;
                  }
                  bVar24 = iVar22 != 0;
                  bVar3 = iVar22 <= (int)uVar16;
                  if (iVar15 < iVar12 && (bVar3 && bVar24)) {
                    if (pEVar2[lVar21 + -1].alpha == '\0') goto LAB_00241f37;
                    iVar17 = iVar17 + 1;
                  }
                  iVar19 = iVar22 + 1;
                  if (iVar19 < (int)uVar16 && iVar15 < iVar12) {
                    if (pEVar2[lVar21 + 1].alpha == '\0') goto LAB_00241f37;
                    iVar17 = iVar17 + 1;
                  }
                  if ((iVar15 <= iVar12) && (iVar15 != 0 && (bVar3 && bVar24))) {
                    if (pEVar2[lVar21 + (long)(int)-uVar16 + -1].alpha == '\0') goto LAB_00241f37;
                    iVar17 = iVar17 + 1;
                  }
                  if (((iVar15 <= iVar12) && (iVar15 != 0)) && (iVar19 < (int)uVar16)) {
                    if (pEVar2[lVar21 + (long)(int)-uVar16 + 1].alpha == '\0') goto LAB_00241f37;
                    iVar17 = iVar17 + 1;
                  }
                  if ((bVar3 && bVar24) && iVar10 < iVar12) {
                    if (pEVar2[lVar21 + ((ulong)uVar16 - 1)].alpha == '\0') goto LAB_00241f37;
                    iVar17 = iVar17 + 1;
                  }
                  if (iVar10 < iVar12 && iVar19 < (int)uVar16) {
                    if (pEVar2[lVar21 + (ulong)uVar16 + 1].alpha == '\0') goto LAB_00241f37;
                    iVar17 = iVar17 + 1;
                  }
                  if (iVar17 == 8) goto LAB_00241f1b;
                }
              }
LAB_00241f37:
              pEVar2 = pEVar20 + lVar21;
              local_68.x = 0;
              local_68.y = 0;
              if ((iVar22 != 0) &&
                 ((iVar22 < (int)(uVar16 - 1) && iVar15 != 0) && iVar15 < iVar12 + -1)) {
                iVar15 = (uint)pEVar2[(int)(1 - uVar16)].alpha * 0x100;
                local_38 = (ulong)pEVar2->alpha;
                local_48 = (ulong)pEVar2->alpha << 8;
                iVar12 = (uint)pEVar2[uVar16 - 1].alpha * 0x100;
                lVar8 = (ulong)pEVar2[(long)(int)uVar16 + 1].alpha * 0x100;
                local_68.x = (int)(((iVar15 + (uint)pEVar2[(int)~uVar16].alpha * -0x100) -
                                   ((int)((ulong)pEVar2[-1].alpha * 0x16a0900 + 0x8000 >> 0x10) +
                                   iVar12)) +
                                  (int)((ulong)pEVar2[1].alpha * 0x16a0900 + 0x8000 >> 0x10)) +
                             lVar8;
                local_68.y = (FT_Pos)(int)((int)((ulong)pEVar2[(int)uVar16].alpha * 0x16a0900 +
                                                 0x8000 >> 0x10) + (int)lVar8 +
                                          (iVar12 - (iVar15 + (uint)pEVar2[(int)~uVar16].alpha *
                                                              0x100 +
                                                    (int)((ulong)pEVar2[(int)-uVar16].alpha *
                                                          0x16a0900 + 0x8000 >> 0x10))));
                FT_Vector_NormLen(&local_68);
                if (local_68.y == 0 || local_68.x == 0) {
                  iVar15 = 0x8000 - (int)local_48;
                }
                else {
                  uVar11 = (uint)local_68.x;
                  uVar16 = -uVar11;
                  if (0 < (int)uVar11) {
                    uVar16 = uVar11;
                  }
                  uVar4 = (uint)local_68.y;
                  uVar11 = -uVar4;
                  if (0 < (int)uVar4) {
                    uVar11 = uVar4;
                  }
                  uVar4 = uVar11;
                  if (uVar16 < uVar11) {
                    uVar4 = uVar16;
                  }
                  uVar23 = (ulong)uVar4;
                  uVar4 = uVar11;
                  if (uVar11 < uVar16) {
                    uVar4 = uVar16;
                  }
                  uVar13 = (ulong)uVar4;
                  FVar6 = FT_DivFix(uVar23,uVar13);
                  iVar12 = (int)local_48;
                  iVar15 = (int)((ulong)(FVar6 - (FVar6 >> 0x3f)) >> 1);
                  pEVar20 = local_58;
                  worker = local_50;
                  if (iVar12 < iVar15) {
                    uVar23 = (long)(uVar13 * (uVar23 * (uint)((int)local_38 << 0x18) + 0x80000000 >>
                                             0x20) * 0x20000 + 0x100000000) >> 0x20 &
                             0xfffffffffffffffe;
                    lVar8 = 0;
                    uVar13 = 0x40000000;
                    do {
                      uVar1 = lVar8 + uVar13;
                      lVar7 = uVar1 + uVar13;
                      if (uVar23 < uVar1) {
                        lVar7 = lVar8;
                      }
                      uVar18 = 0;
                      if (uVar23 >= uVar1) {
                        uVar18 = uVar1;
                      }
                      uVar23 = (uVar23 - uVar18) * 2;
                      bVar3 = 0x81 < uVar13;
                      lVar8 = lVar7;
                      uVar13 = uVar13 >> 1;
                    } while (bVar3);
                    iVar15 = (uVar11 + uVar16 >> 1) - (int)((ulong)lVar7 >> 8);
                  }
                  else if (iVar12 < 0x10000 - iVar15) {
                    lVar8 = uVar13 * (0x8000 - local_48);
                    iVar15 = (int)((ulong)(lVar8 + 0x8000 + (lVar8 >> 0x3f)) >> 0x10);
                  }
                  else {
                    uVar23 = (long)(uVar13 * ((0x10000 - iVar12) * uVar23 * 0x10000 + 0x80000000 >>
                                             0x20) * 0x20000 + 0x100000000) >> 0x20 &
                             0xfffffffffffffffe;
                    lVar8 = 0;
                    uVar13 = 0x40000000;
                    do {
                      uVar1 = lVar8 + uVar13;
                      lVar7 = uVar1 + uVar13;
                      if (uVar23 < uVar1) {
                        lVar7 = lVar8;
                      }
                      uVar18 = 0;
                      if (uVar23 >= uVar1) {
                        uVar18 = uVar1;
                      }
                      uVar23 = (uVar23 - uVar18) * 2;
                      bVar3 = 0x81 < uVar13;
                      lVar8 = lVar7;
                      uVar13 = uVar13 >> 1;
                    } while (bVar3);
                    iVar15 = (int)((ulong)lVar7 >> 8) - (uVar11 + uVar16 >> 1);
                  }
                }
                lVar8 = (long)(int)local_68.x * (long)iVar15;
                local_68.x = (FT_Pos)(int)((ulong)(lVar8 + 0x8000 + (lVar8 >> 0x3f)) >> 0x10);
                lVar8 = (long)(int)local_68.y * (long)iVar15;
                local_68.y = (FT_Pos)(int)((ulong)(lVar8 + 0x8000 + (lVar8 >> 0x3f)) >> 0x10);
                uVar23 = local_40;
              }
              (pEVar2->prox).x = local_68.x;
              (pEVar2->prox).y = local_68.y;
              FVar9 = FT_Vector_Length(&pEVar20[lVar21].prox);
              pEVar2->dist = (FT_16D16)FVar9;
            }
            iVar22 = iVar22 + 1;
            uVar16 = worker->width;
          } while (iVar22 < (int)uVar16);
        }
        uVar16 = (int)uVar23 + 1;
        uVar23 = (ulong)uVar16;
      } while ((int)uVar16 < worker->rows);
    }
    FVar5 = 0;
  }
  return FVar5;
}

Assistant:

static FT_Error
  bsdf_approximate_edge( BSDF_Worker*  worker )
  {
    FT_Error  error = FT_Err_Ok;
    FT_Int    i, j;
    FT_Int    index;
    ED*       ed;


    if ( !worker || !worker->distance_map )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    ed = worker->distance_map;

    for ( j = 0; j < worker->rows; j++ )
    {
      for ( i = 0; i < worker->width; i++ )
      {
        index = j * worker->width + i;

        if ( bsdf_is_edge( worker->distance_map + index,
                           i, j,
                           worker->width,
                           worker->rows ) )
        {
          /* approximate the edge distance for edge pixels */
          ed[index].prox = compute_edge_distance( ed + index,
                                                  i, j,
                                                  worker->width,
                                                  worker->rows );
          ed[index].dist = VECTOR_LENGTH_16D16( ed[index].prox );
        }
        else
        {
          /* for non-edge pixels assign far away distances */
          ed[index].dist   = 400 * ONE;
          ed[index].prox.x = 200 * ONE;
          ed[index].prox.y = 200 * ONE;
        }
      }
    }

  Exit:
    return error;
  }